

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O1

void __thiscall ncnn::Gemm_x86_fma::Gemm_x86_fma(Gemm_x86_fma *this)

{
  Gemm::Gemm(&this->super_Gemm);
  (this->super_Gemm).super_Layer._vptr_Layer = (_func_int **)&PTR__Gemm_x86_fma_00656ad8;
  (this->CT_data).cstep = 0;
  (this->AT_data).data = (void *)0x0;
  (this->AT_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->AT_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->AT_data).elemsize + 4) = 0;
  (this->AT_data).allocator = (Allocator *)0x0;
  (this->AT_data).dims = 0;
  (this->AT_data).w = 0;
  (this->AT_data).w = 0;
  (this->AT_data).h = 0;
  (this->AT_data).d = 0;
  (this->AT_data).c = 0;
  (this->AT_data).cstep = 0;
  (this->BT_data).data = (void *)0x0;
  (this->BT_data).refcount = (int *)0x0;
  (this->BT_data).elemsize = 0;
  (this->BT_data).elempack = 0;
  (this->BT_data).allocator = (Allocator *)0x0;
  (this->BT_data).dims = 0;
  (this->BT_data).w = 0;
  (this->BT_data).w = 0;
  (this->BT_data).h = 0;
  (this->BT_data).d = 0;
  (this->BT_data).c = 0;
  (this->BT_data).cstep = 0;
  (this->CT_data).data = (void *)0x0;
  (this->CT_data).refcount = (int *)0x0;
  (this->CT_data).elemsize = 0;
  (this->CT_data).elempack = 0;
  (this->CT_data).allocator = (Allocator *)0x0;
  (this->CT_data).dims = 0;
  (this->CT_data).w = 0;
  (this->CT_data).w = 0;
  (this->CT_data).h = 0;
  (this->CT_data).d = 0;
  (this->CT_data).c = 0;
  (this->super_Gemm).super_Layer.support_packing = true;
  *(undefined4 *)&(this->super_Gemm).field_0x244 = 0;
  return;
}

Assistant:

Gemm_x86_fma::Gemm_x86_fma()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    nT = 0;
}